

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespace.cpp
# Opt level: O0

_Type_NAMESPACE * __thiscall
LiteScript::_Type_NAMESPACE::ToString_abi_cxx11_(_Type_NAMESPACE *this,Variable *object)

{
  Object *this_00;
  char *pcVar1;
  ostream *poVar2;
  Variable *in_RDX;
  undefined1 local_1f8 [16];
  Variable local_1e8 [2];
  uint local_1c8;
  uint local_1c4;
  uint sz;
  uint i;
  Namespace *nsp;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  Variable *local_20;
  Variable *object_local;
  _Type_NAMESPACE *this_local;
  
  local_20 = in_RDX;
  object_local = object;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(local_198,"{");
  this_00 = Variable::operator->(local_20);
  _sz = Object::GetData<LiteScript::Namespace>(this_00);
  local_1c4 = 0;
  local_1c8 = Namespace::Count(_sz);
  for (; local_1c4 < local_1c8; local_1c4 = local_1c4 + 1) {
    pcVar1 = Namespace::GetKey(_sz,local_1c4);
    poVar2 = std::operator<<(local_198,pcVar1);
    poVar2 = std::operator<<(poVar2,":");
    Namespace::GetVariable((Namespace *)local_1f8,(uint)_sz);
    Variable::operator_cast_to_string((Variable *)(local_1f8 + 0x10));
    pcVar1 = (char *)std::__cxx11::string::c_str();
    std::operator<<(poVar2,pcVar1);
    std::__cxx11::string::~string((string *)(local_1f8 + 0x10));
    Variable::~Variable((Variable *)local_1f8);
    if (local_1c4 < local_1c8 - 1) {
      std::operator<<(local_198,",");
    }
  }
  std::operator<<(local_198,"}");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string LiteScript::_Type_NAMESPACE::ToString(const Variable &object) const {
    std::stringstream ss;
    ss << "{";
    const Namespace& nsp = object->GetData<Namespace>();
    for (unsigned int i = 0, sz = nsp.Count(); i < sz; i++) {
        ss << nsp.GetKey(i) << ":" << ((std::string)(nsp.GetVariable(i))).c_str();
        if (i < sz - 1)
            ss << ",";
    }
    ss << "}";
    return ss.str();
}